

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.hpp
# Opt level: O3

void __thiscall
PieceWiseCubicSpline<2>::_Spline::interp
          (_Spline *this,PieceWiseCubicSpline<2> *host,vector<double,_std::allocator<double>_> *t,
          VectorXd *y)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  uint uVar9;
  _Spline *p_Var10;
  PieceWiseCubicSpline<2> *pPVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  VectorXd d;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  SparseMatrix<double,_0,_int> A;
  ActualDstType actualDst;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  assign_op<double,_double> local_335;
  uint local_334;
  Matrix<double,__1,_1,_0,__1,_1> local_330;
  SrcXprType local_320;
  _Spline *local_310;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> local_308;
  PieceWiseCubicSpline<2> *local_2e8;
  pointer local_2e0;
  ulong local_2d8;
  SparseMatrix<double,_0,_int> local_2d0;
  VectorXd *local_288;
  ulong local_280;
  pointer local_278 [2];
  _Alloc_hider local_268;
  long local_238;
  
  uVar18 = (long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  uVar15 = (long)uVar18 >> 3;
  local_2e8 = host;
  if (uVar15 != (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
     ) {
    __assert_fail("t.size() == y.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                  ,0x44,
                  "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                 );
  }
  this->t_ptr = t;
  pdVar3 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_310 = this;
  if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar15) {
    if ((long)uVar15 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->y,uVar15,uVar15,1);
    if ((local_310->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar15) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  uVar12 = uVar15 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar13 = 0;
    do {
      pdVar6 = pdVar3 + lVar13;
      dVar19 = pdVar6[1];
      pdVar8 = pdVar4 + lVar13;
      *pdVar8 = *pdVar6;
      pdVar8[1] = dVar19;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar12);
  }
  if ((long)uVar12 < (long)uVar15) {
    do {
      pdVar4[uVar12] = pdVar3[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  local_2e0 = (pointer)(long)(int)(uVar18 >> 3);
  local_268._M_p = (pointer)0x0;
  local_278[0] = local_2e0;
  if ((long)local_2e0 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_280 = uVar18;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_330,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_278);
  local_308.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::reserve
            (&local_308,(long)((uVar15 << 0x20) * 3) >> 0x20);
  local_334 = (int)uVar15 - 1;
  local_2d0._0_4_ = 1;
  local_2d8 = uVar15;
  if (2 < (int)uVar15) {
    do {
      if ((int)local_2d0._0_4_ < -1) goto LAB_00107245;
      lVar13 = (long)(int)(local_2d0._0_4_ + 1);
      uVar15 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((((long)uVar15 <= lVar13) || (uVar18 = (ulong)(int)local_2d0._0_4_, uVar15 <= uVar18)) ||
         ((int)local_2d0._0_4_ < 1)) goto LAB_00107245;
      uVar12 = (ulong)(int)(local_2d0._0_4_ - 1);
      if (uVar15 <= uVar12) goto LAB_00107245;
      if (local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          <= (long)uVar18) goto LAB_00107264;
      pdVar3 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar18] = (pdVar3[lVar13] - pdVar3[uVar18]) / (pdVar5[lVar13] - pdVar5[uVar18]) -
                 (pdVar3[uVar18] - pdVar3[uVar12]) / (pdVar5[uVar18] - pdVar5[uVar12]);
      local_278[0] = (pointer)((pdVar5[uVar18] - pdVar5[uVar12]) / 3.0);
      local_320.m_dec._0_4_ = local_2d0._0_4_ - 1;
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar19 = pdVar5[(long)(int)local_2d0._0_4_ + 1] - pdVar5[(long)(int)local_2d0._0_4_ + -1];
      local_278[0] = (pointer)((dVar19 + dVar19) / 3.0);
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int&,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_308,(int *)&local_2d0,(int *)&local_2d0,(double *)local_278);
      local_320.m_dec =
           (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
           CONCAT44(local_320.m_dec._4_4_,local_2d0._0_4_ + 1);
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_278[0] = (pointer)((pdVar5[(long)(int)local_2d0._0_4_ + 1] -
                               pdVar5[(int)local_2d0._0_4_]) / 3.0);
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<int&,int,double>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
      local_2d0._0_4_ = local_2d0._0_4_ + 1;
    } while ((int)local_2d0._0_4_ < (int)local_334);
  }
  pPVar11 = local_2e8;
  if (local_2e8->left_condition_ == FirstDeriv) {
    local_2d0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    local_2d0._1_3_ = 0;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         ((ulong)local_320.m_dec._4_4_ << 0x20);
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = pdVar3[1] - *pdVar3;
    local_278[0] = (pointer)(dVar19 + dVar19);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    local_2d0._0_4_ = 0;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_320.m_dec._4_4_,1);
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_278[0] = (pointer)(pdVar3[1] - *pdVar3);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    uVar14 = (uint)local_2d8;
    if ((y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 2)
    goto LAB_00107245;
    if (local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        1) goto LAB_00107264;
    pdVar3 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         ((pdVar4[1] - *pdVar4) / (pdVar3[1] - *pdVar3) - pPVar11->left_cond_value_) * 3.0;
  }
  else {
    if (local_2e8->left_condition_ != SecondDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x65,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_2d0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)0x0;
    local_2d0._1_3_ = 0;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         ((ulong)local_320.m_dec._4_4_ << 0x20);
    local_278[0] = (pointer)0x4000000000000000;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    local_2d0._0_4_ = 0;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_320.m_dec._4_4_,1);
    local_278[0] = (pointer)0x0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    uVar14 = (uint)local_2d8;
    if (local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
        1) goto LAB_00107264;
    *local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pPVar11->left_cond_value_;
  }
  uVar9 = local_334;
  uVar15 = (ulong)(int)local_334;
  if (pPVar11->right_condition_ == FirstDeriv) {
    local_2d0._0_4_ = local_334;
    local_320.m_dec._0_4_ = local_334;
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = pdVar5[uVar15] - pdVar5[(long)(int)uVar14 + -2];
    local_278[0] = (pointer)(dVar19 + dVar19);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    uVar18 = (long)(int)uVar14 - 2;
    local_2d0._0_4_ = uVar9;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_320.m_dec._4_4_,uVar14 - 2);
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_278[0] = (pointer)(pdVar5[uVar15] - pdVar5[uVar18]);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    if ((((int)uVar14 < 1) ||
        (uVar12 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows, (long)uVar12 <= (long)uVar15)) || (uVar12 <= uVar18)) {
LAB_00107245:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                   );
    }
    if (local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        (long)uVar15) goto LAB_00107264;
    pdVar3 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar19 = (local_2e8->right_cond_value_ -
             (pdVar3[uVar15] - pdVar3[uVar18]) / (pdVar5[uVar15] - pdVar5[uVar18])) * 3.0;
  }
  else {
    if (pPVar11->right_condition_ != SecondDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x77,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_2d0._0_4_ = local_334;
    local_320.m_dec._0_4_ = local_334;
    local_278[0] = (pointer)0x4000000000000000;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    local_2d0._0_4_ = uVar9;
    local_320.m_dec =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
         CONCAT44(local_320.m_dec._4_4_,uVar14 - 2);
    local_278[0] = (pointer)0x0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &local_308,(int *)&local_2d0,(int *)&local_320,(double *)local_278);
    if (((int)uVar14 < 1) ||
       (local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        (long)uVar15)) goto LAB_00107264;
    dVar19 = pPVar11->right_cond_value_;
  }
  local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar15]
       = dVar19;
  local_2d0._0_4_ = local_2d0._0_4_ & 0xffffff00;
  local_2d0.m_outerSize = 0;
  local_2d0.m_innerSize = 0;
  local_2d0.m_outerIndex = (StorageIndex *)0x0;
  local_2d0.m_innerNonZeros = (StorageIndex *)0x0;
  local_2d0.m_data.m_values = (Scalar *)0x0;
  local_2d0.m_data.m_indices = (StorageIndex *)0x0;
  local_2d0.m_data.m_size = 0;
  local_2d0.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_2d0,(Index)local_2e0,(Index)local_2e0);
  local_278[0] = local_308.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_320.m_dec =
       (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
       local_308.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_278,&local_320,&local_2d0,&local_335);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
            );
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
             ,&local_2d0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278
             ,&local_2d0);
  p_Var10 = local_310;
  if (local_278[0]._0_1_ ==
      (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
       )0x0) {
    __assert_fail("m_isInitialized && \"Solver is not initialized.\"",
                  "/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5a,
                  "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double>>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::SparseLU<Eigen::SparseMatrix<double>>, Rhs = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_238 !=
      local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    __assert_fail("derived().rows()==b.rows() && \"solve(): invalid number of rows of the right hand side matrix b\""
                  ,"/usr/include/eigen3/Eigen/src/SparseCore/SparseSolverBase.h",0x5b,
                  "const Solve<Derived, Rhs> Eigen::SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double>>>::solve(const MatrixBase<Rhs> &) const [Derived = Eigen::SparseLU<Eigen::SparseMatrix<double>>, Rhs = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_320.m_rhs = &local_330;
  local_288 = &local_310->b;
  local_320.m_dec =
       (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_278;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(local_288,&local_320,&local_335);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&p_Var10->a,(Index)local_2e0,(Index)local_2e0,1);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_310->c,(Index)local_2e0,(Index)local_2e0,1
            );
  if (1 < uVar14) {
    lVar13 = (local_310->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    pdVar3 = (local_310->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_310->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    uVar18 = (local_310->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    pdVar6 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar7 = (y->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar13 < 2) {
      lVar13 = 1;
    }
    uVar12 = 0;
    if ((long)uVar18 < 1) {
      uVar18 = uVar12;
    }
    uVar16 = (local_310->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    lVar17 = 1;
    if (1 < lVar7) {
      lVar17 = lVar7;
    }
    if ((long)uVar16 < 1) {
      uVar16 = uVar12;
    }
    pdVar8 = (local_310->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    do {
      if ((lVar13 - 1U == uVar12) || (uVar18 == uVar12)) goto LAB_00107264;
      pdVar4[uVar12] =
           ((pdVar3[uVar12 + 1] - pdVar3[uVar12]) / (pdVar5[uVar12 + 1] - pdVar5[uVar12])) / 3.0;
      if (lVar17 - 1U == uVar12) goto LAB_00107245;
      if (uVar16 == uVar12) goto LAB_00107264;
      auVar20._0_8_ = pdVar6[uVar12 + 1] - pdVar6[uVar12];
      auVar20._8_8_ =
           (pdVar3[uVar12] + pdVar3[uVar12] + pdVar3[uVar12 + 1]) *
           (pdVar5[uVar12 + 1] - pdVar5[uVar12]);
      auVar21._8_8_ = 0x4008000000000000;
      auVar21._0_8_ = pdVar5[uVar12 + 1] - pdVar5[uVar12];
      auVar21 = divpd(auVar20,auVar21);
      pdVar8[uVar12] = auVar21._0_8_ - auVar21._8_8_;
      uVar12 = uVar12 + 1;
      uVar14 = (uint)local_2d8;
    } while (local_334 != uVar12);
  }
  bVar2 = local_2e8->force_linear_extrapolation_;
  dVar19 = 0.0;
  if (bVar2 == false) {
    if ((local_310->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 1) goto LAB_00107264;
    dVar19 = *(local_288->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
  }
  local_310->b0 = dVar19;
  uVar18 = (local_310->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (0 < (long)uVar18) {
    pdVar3 = (local_310->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_data;
    local_310->c0 = *pdVar3;
    if ((0 < (int)uVar14) &&
       (uVar12 = (local_310->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows, (long)uVar15 < (long)uVar12)) {
      pdVar5 = (t->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = local_280 * 0x20000000 + -0x200000000;
      dVar19 = pdVar5[uVar15] - *(double *)((long)pdVar5 + (lVar13 >> 0x1d));
      uVar16 = lVar13 >> 0x20;
      pdVar4 = (p_Var10->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data;
      pdVar4[uVar15] = 0.0;
      if (((-1 < (long)uVar16) &&
          (((uVar16 < uVar12 &&
            (uVar12 = (local_310->b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows, (long)uVar16 < (long)uVar12)) && (uVar16 < uVar18)))) &&
         (uVar15 < uVar18)) {
        pdVar6 = (local_288->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        dVar1 = pdVar6[uVar16];
        pdVar3[uVar15] =
             pdVar4[uVar16] * 3.0 * dVar19 * dVar19 + (dVar1 + dVar1) * dVar19 + pdVar3[uVar16];
        if (bVar2 != false) {
          if (uVar12 <= uVar15) goto LAB_00107264;
          pdVar6[uVar15] = 0.0;
        }
        Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                  ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                   local_278);
        free(local_2d0.m_outerIndex);
        free(local_2d0.m_innerNonZeros);
        Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_2d0.m_data);
        if (local_308.
            super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_308.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_308.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_308.
                                super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        free(local_330.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        return;
      }
    }
  }
LAB_00107264:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void interp(PieceWiseCubicSpline<>& host, const vector<double>& t, const Eigen::VectorXd& y) {
      assert(t.size() == y.size());
      const int N = y.size();
      this->t_ptr = &t;
      this->y = y;

      // build Am=d
      Eigen::VectorXd d = Eigen::VectorXd::Zero(N);
      vector<Eigen::Triplet<double>> triplets;
      triplets.reserve(3 * N);

      // build h
      for (int i = 1; i < N - 1; ++i) {
        d[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) - (y[i] - y[i - 1]) / (t[i] - t[i - 1]);
        triplets.emplace_back(i, i - 1, (t[i] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i, 2 * (t[i + 1] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i + 1, (t[i + 1] - t[i]) / 3.0);
      }

      // boundary conditions
      if (host.left_condition_ == SecondDeriv) {
        // 2*b[0] = f''
        triplets.emplace_back(0, 0, 2.0);
        triplets.emplace_back(0, 1, 0.0);

        d[0] = host.left_cond_value_;
      } else if (host.left_condition_ == FirstDeriv) {
        // c[0] = f', needs to be re-expressed in terms of b:
        // (2b[0]+b[1])(x[1]-x[0]) = 3 ((y[1]-y[0])/(x[1]-x[0]) - f')
        triplets.emplace_back(0, 0, 2.0 * (t[1] - t[0]));
        triplets.emplace_back(0, 1, 1.0 * (t[1] - t[0]));

        d[0] = 3.0 * ((y[1] - y[0]) / (t[1] - t[0]) - host.left_cond_value_);
      } else {
        assert(false);
      }
      if (host.right_condition_ == SecondDeriv) {
        // 2*b[n-1] = f''
        triplets.emplace_back(N - 1, N - 1, 2.0);
        triplets.emplace_back(N - 1, N - 2, 0.0);

        d[N - 1] = host.right_cond_value_;

      } else if (host.right_condition_ == FirstDeriv) {
        // c[n-1] = f', needs to be re-expressed in terms of b:
        // (b[n-2]+2b[n-1])(x[n-1]-x[n-2])
        // = 3 (f' - (y[n-1]-y[n-2])/(x[n-1]-x[n-2]))
        triplets.emplace_back(N - 1, N - 1, 2.0 * (t[N - 1] - t[N - 2]));
        triplets.emplace_back(N - 1, N - 2, 1.0 * (t[N - 1] - t[N - 2]));

        d[N - 1] = 3.0 * (host.right_cond_value_ - (y[N - 1] - y[N - 2]) / (t[N - 1] - t[N - 2]));
      } else {
        assert(false);
      }

      // solve the equation system to obtain the parameters b[]
      Eigen::SparseMatrix<double> A(N, N);
      A.setFromTriplets(triplets.begin(), triplets.end());

      Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
      solver.compute(A);
      b = solver.solve(d);

      a.resize(N);
      c.resize(N);
      for (int i = 0; i < N - 1; i++) {
        a[i] = (b[i + 1] - b[i]) / (t[i + 1] - t[i]) / 3.0;
        c[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) -
               (2.0 * b[i] + b[i + 1]) * (t[i + 1] - t[i]) / 3.0;
      }

      // for left extrapolation coefficients
      b0 = (!host.force_linear_extrapolation_) ? b[0] : 0.0;
      c0 = c[0];

      // for the right extrapolation coefficients
      // f_{n-1}(x) = b*(x-x_{n-1})^2 + c*(x-x_{n-1}) + y{n-1}
      double h = t[N - 1] - t[N - 2];
      // b[N-1] is determined by the boundary condition
      a[N - 1] = 0.0;
      c[N - 1] = 3.0 * a[N - 2] * h * h + 2.0 * b[N - 2] * h + c[N - 2];  // = f'_{n-2}(x_{n-1})
      if (host.force_linear_extrapolation_) {
        {
          b[N - 1] = 0.0;
        }
      }
    }